

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::decode_url
                   (string *__return_storage_ptr__,string *s,bool convert_plus_to_space)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  int local_4c;
  size_t sStack_48;
  int val_1;
  size_t len;
  char buff [4];
  int local_2c;
  size_type sStack_28;
  int val;
  size_t i;
  string *psStack_18;
  bool convert_plus_to_space_local;
  string *s_local;
  string *result;
  
  i._6_1_ = 0;
  i._7_1_ = convert_plus_to_space;
  psStack_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (sStack_28 = 0; uVar4 = sStack_28,
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (psStack_18), uVar4 < sVar2; sStack_28 = sStack_28 + 1) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,sStack_28);
    if ((*pvVar3 == '%') &&
       (uVar4 = sStack_28 + 1,
       sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (psStack_18), uVar4 < sVar2)) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](psStack_18,sStack_28 + 1);
      if (*pvVar3 == 'u') {
        local_2c = 0;
        bVar1 = from_hex_to_i(psStack_18,sStack_28 + 2,4,&local_2c);
        if (bVar1) {
          sStack_48 = to_utf8(local_2c,(char *)&len);
          if (sStack_48 != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,(char *)&len,sStack_48);
          }
          sStack_28 = sStack_28 + 5;
        }
        else {
          pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](psStack_18,sStack_28);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,*pvVar3);
        }
      }
      else {
        local_4c = 0;
        bVar1 = from_hex_to_i(psStack_18,sStack_28 + 1,2,&local_4c);
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,(char)local_4c);
          sStack_28 = sStack_28 + 2;
        }
        else {
          pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](psStack_18,sStack_28);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,*pvVar3);
        }
      }
    }
    else if (((i._7_1_ & 1) == 0) ||
            (pvVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (psStack_18,sStack_28), *pvVar3 != '+')) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](psStack_18,sStack_28);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,*pvVar3);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,' ');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string &s,
                              bool convert_plus_to_space) {
  std::string result;

  for (size_t i = 0; i < s.size(); i++) {
    if (s[i] == '%' && i + 1 < s.size()) {
      if (s[i + 1] == 'u') {
        int val = 0;
        if (from_hex_to_i(s, i + 2, 4, val)) {
          // 4 digits Unicode codes
          char buff[4];
          size_t len = to_utf8(val, buff);
          if (len > 0) { result.append(buff, len); }
          i += 5; // 'u0000'
        } else {
          result += s[i];
        }
      } else {
        int val = 0;
        if (from_hex_to_i(s, i + 1, 2, val)) {
          // 2 digits hex codes
          result += static_cast<char>(val);
          i += 2; // '00'
        } else {
          result += s[i];
        }
      }
    } else if (convert_plus_to_space && s[i] == '+') {
      result += ' ';
    } else {
      result += s[i];
    }
  }

  return result;
}